

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O2

void __thiscall QSslContext::QSslContext(QSslContext *this)

{
  (this->m_sessionASN1).d.ptr = (char *)0x0;
  (this->m_sessionASN1).d.size = 0;
  this->session = (SSL_SESSION *)0x0;
  (this->m_sessionASN1).d.d = (Data *)0x0;
  this->ctx = (SSL_CTX *)0x0;
  this->pkey = (EVP_PKEY *)0x0;
  this->m_sessionTicketLifeTimeHint = -1;
  *(undefined8 *)&this->errorCode = 0;
  *(undefined8 *)((long)&(this->errorStr).d.d + 4) = 0;
  (this->errorStr).d.ptr = (char16_t *)0x0;
  (this->errorStr).d.size = 0;
  QSslConfiguration::QSslConfiguration(&this->sslConfiguration);
  (this->m_npnContext).status = NextProtocolNegotiationNone;
  (this->m_supportedNPNVersions).d.d = (Data *)0x0;
  (this->m_supportedNPNVersions).d.ptr = (char *)0x0;
  (this->m_supportedNPNVersions).d.size = 0;
  (this->m_npnContext).data = (uchar *)0x0;
  (this->m_npnContext).len = 0;
  return;
}

Assistant:

QSslContext::QSslContext()
    : ctx(nullptr),
    pkey(nullptr),
    session(nullptr),
    m_sessionTicketLifeTimeHint(-1)
{
}